

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::yml::Tree::_next_node_modify(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  ulong uVar1;
  ulong uVar2;
  NodeData *pNVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  bool bVar16;
  size_t sVar17;
  NodeData *pNVar18;
  csubstr *pcVar19;
  size_t sVar20;
  undefined8 extraout_RAX;
  long lVar21;
  NodeType_e NVar22;
  size_t *psVar23;
  Location *pLVar24;
  size_t sVar25;
  byte bVar26;
  csubstr cVar27;
  basic_substring<const_char> bVar28;
  csubstr str;
  char msg [46];
  size_t pos;
  Location local_288;
  undefined1 uStack_260;
  undefined1 uStack_25f;
  undefined4 uStack_25e;
  undefined2 uStack_25a;
  undefined2 local_240;
  undefined1 local_23e;
  char local_231;
  _lookup_path_token local_230;
  lookup_result *local_218;
  Location local_210;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  Location local_58;
  
  bVar26 = 0;
  _next_token(&local_230,this,r,parent);
  sVar17 = local_230.value.len;
  switch(local_230.type.type) {
  case NOTYPE:
    return 0xffffffffffffffff;
  default:
    _next_node_modify();
    __clang_call_terminate(extraout_RAX);
  case KEY:
    if (((((char *)local_230.value.len == (char *)0x0) ||
         ((char *)local_230.value.len == (char *)0x0)) || (*local_230.value.str != '[')) ||
       ((local_230.value.str + -1)[local_230.value.len] != ']')) {
      psVar23 = (size_t *)
                "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pLVar24 = &local_288;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        (pLVar24->super_LineCol).offset = *psVar23;
        psVar23 = psVar23 + (ulong)bVar26 * -2 + 1;
        pLVar24 = (Location *)((long)pLVar24 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      local_23e = 0;
      local_240 = 0x2929;
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_170 = 0;
      uStack_168 = 26999;
      local_160 = 0;
      pcStack_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_150 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(26999) << 0x40);
      LVar11.name.str._0_4_ = 0x1fbf6a;
      LVar11.super_LineCol.offset = auVar6._0_8_;
      LVar11.super_LineCol.line = auVar6._8_8_;
      LVar11.super_LineCol.col = auVar6._16_8_;
      LVar11.name.str._4_4_ = 0;
      LVar11.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_288,0x4b,LVar11,(this->m_callbacks).m_user_data)
      ;
    }
    if ((char *)sVar17 == (char *)0x0) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      handle_error(0x1fc017,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1560,"left >= 0 && left <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)&local_288,local_230.value.str + 1,
               (size_t)(sVar17 + -2));
    local_210.super_LineCol.offset =
         CONCAT44(local_288.super_LineCol.offset._4_4_,(undefined4)local_288.super_LineCol.offset);
    local_218 = (lookup_result *)parent;
    bVar28 = basic_substring<const_char>::triml((basic_substring<const_char> *)&local_210,' ');
    local_288.super_LineCol.offset._0_4_ = bVar28.str._0_4_;
    local_288.super_LineCol.offset._4_4_ = bVar28.str._4_4_;
    local_288.super_LineCol.line._0_4_ = (undefined4)bVar28.len;
    local_288.super_LineCol.line._4_4_ = bVar28.len._4_4_;
    local_230.value =
         basic_substring<const_char>::trimr((basic_substring<const_char> *)&local_288,' ');
    str.len = (size_t)&local_210;
    str.str = (char *)local_230.value.len;
    local_231 = atou<unsigned_long>((c4 *)local_230.value.str,str,(unsigned_long *)&local_210);
    sVar17 = 0xffffffffffffffff;
    if ((bool)local_231) {
      uVar1 = r->closest;
      if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[uVar1].m_type.type & (STREAM|MAP)) == NOTYPE) {
        pNVar18 = _p(this,r->closest);
        if (((pNVar18->m_type).type & KEY) == NOTYPE) {
          _clear_type(this,r->closest);
          to_seq(this,r->closest,0);
        }
        else {
          pcVar19 = key(this,r->closest);
          cVar27 = *pcVar19;
          _clear_type(this,r->closest);
          to_seq(this,r->closest,cVar27,0);
        }
      }
      uVar1 = r->closest;
      if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[uVar1].m_type.type & (STREAM|MAP)) == NOTYPE) {
        local_288.name.len._0_1_ = 0x6c;
        local_288.name.len._1_1_ = 0x6f;
        local_288.name.len._2_1_ = 0x73;
        local_288.name.len._3_1_ = 0x65;
        local_288.name.len._4_2_ = 0x7473;
        local_288.name.len._6_2_ = 0x2929;
        uStack_260 = 0;
        local_288.super_LineCol.col._0_4_ = 0x6f635f73;
        local_288.super_LineCol.col._4_4_ = 0x6961746e;
        local_288.name.str._0_1_ = 0x6e;
        local_288.name.str._1_1_ = 0x65;
        local_288.name.str._2_2_ = 0x2872;
        local_288.name.str._4_1_ = 0x72;
        local_288.name.str._5_1_ = 0x2d;
        local_288.name.str._6_1_ = 0x3e;
        local_288.name.str._7_1_ = 99;
        local_288.super_LineCol.offset._0_4_ = 0x63656863;
        local_288.super_LineCol.offset._4_4_ = 0x6166206b;
        local_288.super_LineCol.line._0_4_ = 0x64656c69;
        local_288.super_LineCol.line._4_4_ = 0x6928203a;
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_198 = 0;
        uStack_190 = 0x698a;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x698a) << 0x40);
        LVar13.name.str._0_4_ = 0x1fbf6a;
        LVar13.super_LineCol.offset = auVar6._0_8_;
        LVar13.super_LineCol.line = auVar6._8_8_;
        LVar13.super_LineCol.col = auVar6._16_8_;
        LVar13.name.str._4_4_ = 0;
        LVar13.name.len = 0x65;
        (*(this->m_callbacks).m_error)
                  ((char *)&local_288,0x29,LVar13,(this->m_callbacks).m_user_data);
      }
      sVar17 = child(this,r->closest,local_210.super_LineCol.offset);
      if (sVar17 == 0xffffffffffffffff) {
        sVar17 = num_children(this,r->closest);
        if (local_210.super_LineCol.offset < sVar17) {
          local_288.name.len._0_1_ = 0x6c;
          local_288.name.len._1_1_ = 0x6f;
          local_288.name.len._2_1_ = 0x73;
          local_288.name.len._3_1_ = 0x65;
          local_288.name.len._4_2_ = 0x7473;
          local_288.name.len._6_2_ = 0x2029;
          uStack_260 = 0x3c;
          uStack_25f = 0x3d;
          uStack_25e = 0x78646920;
          uStack_25a = 0x29;
          local_288.super_LineCol.col._0_4_ = 0x635f6d75;
          local_288.super_LineCol.col._4_4_ = 0x646c6968;
          local_288.name.str._0_1_ = 0x72;
          local_288.name.str._1_1_ = 0x65;
          local_288.name.str._2_2_ = 0x286e;
          local_288.name.str._4_1_ = 0x72;
          local_288.name.str._5_1_ = 0x2d;
          local_288.name.str._6_1_ = 0x3e;
          local_288.name.str._7_1_ = 99;
          local_288.super_LineCol.offset._0_4_ = 0x63656863;
          local_288.super_LineCol.offset._4_4_ = 0x6166206b;
          local_288.super_LineCol.line._0_4_ = 0x64656c69;
          local_288.super_LineCol.line._4_4_ = 0x6e28203a;
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          local_1c0 = 0;
          uStack_1b8 = 0x698e;
          local_1b0 = 0;
          pcStack_1a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1a0 = 0x65;
          auVar6 = ZEXT1224(ZEXT412(0x698e) << 0x40);
          LVar14.name.str._0_4_ = 0x1fbf6a;
          LVar14.super_LineCol.offset = auVar6._0_8_;
          LVar14.super_LineCol.line = auVar6._8_8_;
          LVar14.super_LineCol.col = auVar6._16_8_;
          LVar14.name.str._4_4_ = 0;
          LVar14.name.len = 0x65;
          (*(this->m_callbacks).m_error)
                    ((char *)&local_288,0x30,LVar14,(this->m_callbacks).m_user_data);
        }
        sVar20 = num_children(this,r->closest);
        sVar17 = 0xffffffffffffffff;
        if (sVar20 <= local_210.super_LineCol.offset) {
          do {
            sVar25 = r->closest;
            if ((sVar25 == 0xffffffffffffffff) || (this->m_cap <= sVar25)) {
              if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                pcVar4 = (code *)swi(3);
                sVar17 = (*pcVar4)();
                return sVar17;
              }
              local_288.super_LineCol.offset._0_4_ = 0;
              local_288.super_LineCol.offset._4_4_ = 0;
              local_288.super_LineCol.line._0_4_ = 0x4b83;
              local_288.super_LineCol.line._4_4_ = 0;
              local_288.super_LineCol.col._0_4_ = 0;
              local_288.super_LineCol.col._4_4_ = 0;
              local_288.name.str._0_1_ = 0x6a;
              local_288.name.str._1_1_ = 0xbf;
              local_288.name.str._2_2_ = 0x1f;
              local_288.name.str._4_1_ = 0;
              local_288.name.str._5_1_ = 0;
              local_288.name.str._6_1_ = 0;
              local_288.name.str._7_1_ = 0;
              local_288.name.len._0_1_ = 0x65;
              local_288.name.len._1_1_ = 0;
              local_288.name.len._2_1_ = 0;
              local_288.name.len._3_1_ = 0;
              local_288.name.len._4_2_ = 0;
              local_288.name.len._6_2_ = 0;
              (*(code *)PTR_error_impl_0023e4c8)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            uVar1 = this->m_buf[sVar25].m_last_child;
            if (sVar25 == 0xffffffffffffffff) {
              if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                pcVar4 = (code *)swi(3);
                sVar17 = (*pcVar4)();
                return sVar17;
              }
              local_288.super_LineCol.offset._0_4_ = 0;
              local_288.super_LineCol.offset._4_4_ = 0;
              local_288.super_LineCol.line._0_4_ = 0x4cb1;
              local_288.super_LineCol.line._4_4_ = 0;
              local_288.super_LineCol.col._0_4_ = 0;
              local_288.super_LineCol.col._4_4_ = 0;
              local_288.name.str._0_1_ = 0x6a;
              local_288.name.str._1_1_ = 0xbf;
              local_288.name.str._2_2_ = 0x1f;
              local_288.name.str._4_1_ = 0;
              local_288.name.str._5_1_ = 0;
              local_288.name.str._6_1_ = 0;
              local_288.name.str._7_1_ = 0;
              local_288.name.len._0_1_ = 0x65;
              local_288.name.len._1_1_ = 0;
              local_288.name.len._2_1_ = 0;
              local_288.name.len._3_1_ = 0;
              local_288.name.len._4_2_ = 0;
              local_288.name.len._6_2_ = 0;
              (*(code *)PTR_error_impl_0023e4c8)
                        ("check failed: parent != NONE",0x1c,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if ((sVar25 == 0xffffffffffffffff) || (this->m_cap <= sVar25)) {
              if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                pcVar4 = (code *)swi(3);
                sVar17 = (*pcVar4)();
                return sVar17;
              }
              local_288.super_LineCol.offset._0_4_ = 0;
              local_288.super_LineCol.offset._4_4_ = 0;
              local_288.super_LineCol.line._0_4_ = 0x4b86;
              local_288.super_LineCol.line._4_4_ = 0;
              local_288.super_LineCol.col._0_4_ = 0;
              local_288.super_LineCol.col._4_4_ = 0;
              local_288.name.str._0_1_ = 0x6a;
              local_288.name.str._1_1_ = 0xbf;
              local_288.name.str._2_2_ = 0x1f;
              local_288.name.str._4_1_ = 0;
              local_288.name.str._5_1_ = 0;
              local_288.name.str._6_1_ = 0;
              local_288.name.str._7_1_ = 0;
              local_288.name.len._0_1_ = 0x65;
              local_288.name.len._1_1_ = 0;
              local_288.name.len._2_1_ = 0;
              local_288.name.len._3_1_ = 0;
              local_288.name.len._4_2_ = 0;
              local_288.name.len._6_2_ = 0;
              (*(code *)PTR_error_impl_0023e4c8)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if (((this->m_buf[sVar25].m_type.type & (STREAM|MAP)) == NOTYPE) &&
               (bVar16 = is_root(this,sVar25), !bVar16)) {
              if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                pcVar4 = (code *)swi(3);
                sVar17 = (*pcVar4)();
                return sVar17;
              }
              local_288.super_LineCol.offset._0_4_ = 0;
              local_288.super_LineCol.offset._4_4_ = 0;
              local_288.super_LineCol.line._0_4_ = 0x4cb2;
              local_288.super_LineCol.line._4_4_ = 0;
              local_288.super_LineCol.col._0_4_ = 0;
              local_288.super_LineCol.col._4_4_ = 0;
              local_288.name.str._0_1_ = 0x6a;
              local_288.name.str._1_1_ = 0xbf;
              local_288.name.str._2_2_ = 0x1f;
              local_288.name.str._4_1_ = 0;
              local_288.name.str._5_1_ = 0;
              local_288.name.str._6_1_ = 0;
              local_288.name.str._7_1_ = 0;
              local_288.name.len._0_1_ = 0x65;
              local_288.name.len._1_1_ = 0;
              local_288.name.len._2_1_ = 0;
              local_288.name.len._3_1_ = 0;
              local_288.name.len._4_2_ = 0;
              local_288.name.len._6_2_ = 0;
              (*(code *)PTR_error_impl_0023e4c8)
                        ("check failed: is_container(parent) || is_root(parent)",0x35,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if (uVar1 != 0xffffffffffffffff) {
              if (this->m_cap <= uVar1) {
                if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                  pcVar4 = (code *)swi(3);
                  sVar17 = (*pcVar4)();
                  return sVar17;
                }
                local_288.super_LineCol.offset._0_4_ = 0;
                local_288.super_LineCol.offset._4_4_ = 0;
                local_288.super_LineCol.line._0_4_ = 0x4b83;
                local_288.super_LineCol.line._4_4_ = 0;
                local_288.super_LineCol.col._0_4_ = 0;
                local_288.super_LineCol.col._4_4_ = 0;
                local_288.name.str._0_1_ = 0x6a;
                local_288.name.str._1_1_ = 0xbf;
                local_288.name.str._2_2_ = 0x1f;
                local_288.name.str._4_1_ = 0;
                local_288.name.str._5_1_ = 0;
                local_288.name.str._6_1_ = 0;
                local_288.name.str._7_1_ = 0;
                local_288.name.len._0_1_ = 0x65;
                local_288.name.len._1_1_ = 0;
                local_288.name.len._2_1_ = 0;
                local_288.name.len._3_1_ = 0;
                local_288.name.len._4_2_ = 0;
                local_288.name.len._6_2_ = 0;
                (*(code *)PTR_error_impl_0023e4c8)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              if (this->m_buf[uVar1].m_parent != sVar25) {
                if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                  pcVar4 = (code *)swi(3);
                  sVar17 = (*pcVar4)();
                  return sVar17;
                }
                local_288.super_LineCol.offset._0_4_ = 0;
                local_288.super_LineCol.offset._4_4_ = 0;
                local_288.super_LineCol.line._0_4_ = 0x4cb3;
                local_288.super_LineCol.line._4_4_ = 0;
                local_288.super_LineCol.col._0_4_ = 0;
                local_288.super_LineCol.col._4_4_ = 0;
                local_288.name.str._0_1_ = 0x6a;
                local_288.name.str._1_1_ = 0xbf;
                local_288.name.str._2_2_ = 0x1f;
                local_288.name.str._4_1_ = 0;
                local_288.name.str._5_1_ = 0;
                local_288.name.str._6_1_ = 0;
                local_288.name.str._7_1_ = 0;
                local_288.name.len._0_1_ = 0x65;
                local_288.name.len._1_1_ = 0;
                local_288.name.len._2_1_ = 0;
                local_288.name.len._3_1_ = 0;
                local_288.name.len._4_2_ = 0;
                local_288.name.len._6_2_ = 0;
                (*(code *)PTR_error_impl_0023e4c8)
                          ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                           (anonymous_namespace)::s_default_callbacks);
              }
            }
            sVar17 = _claim(this);
            _set_hierarchy(this,sVar17,sVar25,uVar1);
            if (sVar20 < local_210.super_LineCol.offset) {
              uVar1 = r->closest;
              if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                  pcVar4 = (code *)swi(3);
                  sVar17 = (*pcVar4)();
                  return sVar17;
                }
                local_288.super_LineCol.offset._0_4_ = 0;
                local_288.super_LineCol.offset._4_4_ = 0;
                local_288.super_LineCol.line._0_4_ = 0x4b86;
                local_288.super_LineCol.line._4_4_ = 0;
                local_288.super_LineCol.col._0_4_ = 0;
                local_288.super_LineCol.col._4_4_ = 0;
                local_288.name.str._0_1_ = 0x6a;
                local_288.name.str._1_1_ = 0xbf;
                local_288.name.str._2_2_ = 0x1f;
                local_288.name.str._4_1_ = 0;
                local_288.name.str._5_1_ = 0;
                local_288.name.str._6_1_ = 0;
                local_288.name.str._7_1_ = 0;
                local_288.name.len._0_1_ = 0x65;
                local_288.name.len._1_1_ = 0;
                local_288.name.len._2_1_ = 0;
                local_288.name.len._3_1_ = 0;
                local_288.name.len._4_2_ = 0;
                local_288.name.len._6_2_ = 0;
                (*(code *)PTR_error_impl_0023e4c8)
                          ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                           (anonymous_namespace)::s_default_callbacks);
              }
              if ((this->m_buf[uVar1].m_type.type & MAP) == NOTYPE) {
                uVar1 = r->closest;
                if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
                  if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
                    pcVar4 = (code *)swi(3);
                    sVar17 = (*pcVar4)();
                    return sVar17;
                  }
                  local_288.super_LineCol.offset._0_4_ = 0;
                  local_288.super_LineCol.offset._4_4_ = 0;
                  local_288.super_LineCol.line._0_4_ = 0x4b86;
                  local_288.super_LineCol.line._4_4_ = 0;
                  local_288.super_LineCol.col._0_4_ = 0;
                  local_288.super_LineCol.col._4_4_ = 0;
                  local_288.name.str._0_1_ = 0x6a;
                  local_288.name.str._1_1_ = 0xbf;
                  local_288.name.str._2_2_ = 0x1f;
                  local_288.name.str._4_1_ = 0;
                  local_288.name.str._5_1_ = 0;
                  local_288.name.str._6_1_ = 0;
                  local_288.name.str._7_1_ = 0;
                  local_288.name.len._0_1_ = 0x65;
                  local_288.name.len._1_1_ = 0;
                  local_288.name.len._2_1_ = 0;
                  local_288.name.len._3_1_ = 0;
                  local_288.name.len._4_2_ = 0;
                  local_288.name.len._6_2_ = 0;
                  (*(code *)PTR_error_impl_0023e4c8)
                            ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                             (anonymous_namespace)::s_default_callbacks);
                }
                if ((this->m_buf[uVar1].m_type.type & SEQ) != NOTYPE) {
                  to_val(this,sVar17,(csubstr)ZEXT816(0),0);
                }
              }
              else {
                to_keyval(this,sVar17,(csubstr)ZEXT816(0),(csubstr)ZEXT816(0),0);
              }
            }
            sVar20 = sVar20 + 1;
          } while (sVar20 <= local_210.super_LineCol.offset);
        }
      }
    }
    parent = (_lookup_path_token *)local_218;
    if (local_231 == '\0') {
      return 0xffffffffffffffff;
    }
    goto LAB_001cb32c;
  case KEYVAL:
    cVar27 = lookup_result::unresolved(r);
    if (cVar27.str != (char *)0x0 && cVar27.len != 0) {
      local_288.super_LineCol.col._0_4_ = 0x6e753e2d;
      local_288.super_LineCol.col._4_4_ = 0x6f736572;
      local_288.name.str._0_1_ = 0x6c;
      local_288.name.str._1_1_ = 0x76;
      local_288.name.str._2_2_ = 0x6465;
      local_288.name.str._4_1_ = 0x28;
      local_288.name.str._5_1_ = 0x29;
      local_288.name.str._6_1_ = 0x2e;
      local_288.name.str._7_1_ = 0x65;
      local_288.super_LineCol.offset._0_4_ = 0x63656863;
      local_288.super_LineCol.offset._4_4_ = 0x6166206b;
      local_288.super_LineCol.line._0_4_ = 0x64656c69;
      local_288.super_LineCol.line._4_4_ = 0x7228203a;
      local_288.name.len._0_1_ = 0x6d;
      local_288.name.len._1_1_ = 0x70;
      local_288.name.len._2_1_ = 0x74;
      local_288.name.len._3_1_ = 0x79;
      local_288.name.len._4_2_ = 0x2928;
      local_288.name.len._6_2_ = 0x29;
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_120 = 0;
      uStack_118 = 0x6963;
      local_110 = 0;
      pcStack_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(0x6963) << 0x40);
      LVar9.name.str._0_4_ = 0x1fbf6a;
      LVar9.super_LineCol.offset = auVar6._0_8_;
      LVar9.super_LineCol.line = auVar6._8_8_;
      LVar9.super_LineCol.col = auVar6._16_8_;
      LVar9.name.str._4_4_ = 0;
      LVar9.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_288,0x28,LVar9,(this->m_callbacks).m_user_data);
    }
    uVar1 = r->closest;
    if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b86;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    sVar17 = r->closest;
    if ((this->m_buf[uVar1].m_type.type & MAP) == NOTYPE) {
      if ((sVar17 == 0xffffffffffffffff) || (this->m_cap <= sVar17)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[sVar17].m_type.type & SEQ) != NOTYPE) {
        local_288.super_LineCol.col._0_4_ = 0x735f7369;
        local_288.super_LineCol.col._4_4_ = 0x72287165;
        local_288.name.str._0_1_ = 0x2d;
        local_288.name.str._1_1_ = 0x3e;
        local_288.name.str._2_2_ = 0x6c63;
        local_288.name.str._4_1_ = 0x6f;
        local_288.name.str._5_1_ = 0x73;
        local_288.name.str._6_1_ = 0x65;
        local_288.name.str._7_1_ = 0x73;
        local_288.super_LineCol.offset._0_4_ = 0x63656863;
        local_288.super_LineCol.offset._4_4_ = 0x6166206b;
        local_288.super_LineCol.line._0_4_ = 0x64656c69;
        local_288.super_LineCol.line._4_4_ = 0x2128203a;
        local_288.name.len._0_1_ = 0x74;
        local_288.name.len._1_1_ = 0x29;
        local_288.name.len._2_1_ = 0x29;
        local_288.name.len._3_1_ = 0;
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_148 = 0;
        uStack_140 = 0x696c;
        local_138 = 0;
        pcStack_130 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_128 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x696c) << 0x40);
        LVar10.name.str._0_4_ = 0x1fbf6a;
        LVar10.super_LineCol.offset = auVar6._0_8_;
        LVar10.super_LineCol.line = auVar6._8_8_;
        LVar10.super_LineCol.col = auVar6._16_8_;
        LVar10.name.str._4_4_ = 0;
        LVar10.name.len = 0x65;
        (*(this->m_callbacks).m_error)
                  ((char *)&local_288,0x24,LVar10,(this->m_callbacks).m_user_data);
      }
      sVar17 = r->closest;
      local_218 = r;
      if ((sVar17 == 0xffffffffffffffff) || (this->m_cap <= sVar17)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b83;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar18 = this->m_buf;
      NVar22 = pNVar18[sVar17].m_type.type | MAP;
      _check_next_flags(this,sVar17,NVar22);
      pNVar18[sVar17].m_type.type = NVar22;
      sVar20 = local_218->closest;
      if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b83;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      sVar25 = this->m_buf[sVar20].m_last_child;
      if (sVar20 == 0xffffffffffffffff) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        Location::Location(&local_210,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x4cb1,0);
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      }
      if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (((this->m_buf[sVar20].m_type.type & (STREAM|MAP)) == NOTYPE) &&
         (bVar16 = is_root(this,sVar20), !bVar16)) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        Location::Location(&local_288,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x4cb2,0);
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((sVar25 != 0xffffffffffffffff) && (pNVar18 = _p(this,sVar25), pNVar18->m_parent != sVar20)
         ) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
LAB_001ca551:
        Location::Location(&local_58,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x4cb3,0);
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
LAB_001ca5a6:
      sVar17 = _claim(this);
      _set_hierarchy(this,sVar17,sVar20,sVar25);
    }
    else {
      sVar17 = find_child(this,sVar17,&local_230.value);
      if (sVar17 == 0xffffffffffffffff) {
        sVar20 = r->closest;
        pNVar18 = _p(this,sVar20);
        sVar25 = pNVar18->m_last_child;
        if (sVar20 == 0xffffffffffffffff) {
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          Location::Location(&local_288,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x4cb1,0);
          (*(code *)PTR_error_impl_0023e4c8)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
        }
        pNVar18 = _p(this,sVar20);
        if ((((pNVar18->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar16 = is_root(this,sVar20), !bVar16)) {
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          Location::Location(&local_210,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x4cb2,0);
          (*(code *)PTR_error_impl_0023e4c8)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((sVar25 != 0xffffffffffffffff) &&
           (pNVar18 = _p(this,sVar25), pNVar18->m_parent != sVar20)) {
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          goto LAB_001ca551;
        }
        goto LAB_001ca5a6;
      }
    }
    if ((sVar17 == 0xffffffffffffffff) || (this->m_cap <= sVar17)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b83;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar3 = this->m_buf;
    pNVar18 = pNVar3 + sVar17;
    pcVar19 = &pNVar3[sVar17].m_key.scalar;
    pcVar19->str = local_230.value.str;
    pcVar19->len = local_230.value.len;
    pNVar3[sVar17].m_val.scalar.str = "";
    pNVar3[sVar17].m_val.scalar.len = 0;
    NVar22 = KEYVAL;
    break;
  case MAP:
  case SEQ:
    if (((char *)local_230.value.len != (char *)0x0) && (*local_230.value.str == '[')) {
      local_288.name.len._0_1_ = 0x6e;
      local_288.name.len._1_1_ = 0x73;
      local_288.name.len._2_1_ = 0x5f;
      local_288.name.len._3_1_ = 0x77;
      local_288.name.len._4_2_ = 0x7469;
      local_288.name.len._6_2_ = 0x2868;
      uStack_260 = 0x27;
      uStack_25f = 0x5b;
      uStack_25e = 0x292927;
      local_288.super_LineCol.col._0_4_ = 0x656b6f74;
      local_288.super_LineCol.col._4_4_ = 0x61762e6e;
      local_288.name.str._0_1_ = 0x6c;
      local_288.name.str._1_1_ = 0x75;
      local_288.name.str._2_2_ = 0x2e65;
      local_288.name.str._4_1_ = 0x62;
      local_288.name.str._5_1_ = 0x65;
      local_288.name.str._6_1_ = 0x67;
      local_288.name.str._7_1_ = 0x69;
      local_288.super_LineCol.offset._0_4_ = 0x63656863;
      local_288.super_LineCol.offset._4_4_ = 0x6166206b;
      local_288.super_LineCol.line._0_4_ = 0x64656c69;
      local_288.super_LineCol.line._4_4_ = 0x2128203a;
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_80 = 0;
      uStack_78 = 0x6943;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(0x6943) << 0x40);
      LVar5.name.str._0_4_ = 0x1fbf6a;
      LVar5.super_LineCol.offset = auVar6._0_8_;
      LVar5.super_LineCol.line = auVar6._8_8_;
      LVar5.super_LineCol.col = auVar6._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_288,0x2e,LVar5,(this->m_callbacks).m_user_data);
    }
    uVar1 = r->closest;
    if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b86;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar2 = r->closest;
    bVar16 = this->m_cap <= uVar2;
    if ((this->m_buf[uVar1].m_type.type & (STREAM|MAP)) == NOTYPE) {
      if (bVar16 || uVar2 == 0xffffffffffffffff) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      sVar17 = r->closest;
      if ((this->m_buf[uVar2].m_type.type & KEY) == NOTYPE) {
        to_map(this,sVar17,0);
      }
      else {
        pcVar19 = key(this,sVar17);
        to_map(this,sVar17,*pcVar19,0);
      }
      sVar17 = 0xffffffffffffffff;
    }
    else {
      if (bVar16 || uVar2 == 0xffffffffffffffff) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b86;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[uVar2].m_type.type & MAP) == NOTYPE) {
        local_210.super_LineCol.offset = 0xffffffffffffffff;
        cVar27.len = (size_t)&local_210;
        cVar27.str = (char *)sVar17;
        bVar16 = atou<unsigned_long>((c4 *)local_230.value.str,cVar27,
                                     (unsigned_long *)(uVar2 * 0x90));
        if (!bVar16) {
          local_288.name.len._0_1_ = 0x75;
          local_288.name.len._1_1_ = 0x65;
          local_288.name.len._2_1_ = 0x2c;
          local_288.name.len._3_1_ = 0x20;
          local_288.name.len._4_2_ = 0x7026;
          local_288.name.len._6_2_ = 0x736f;
          uStack_260 = 0x29;
          uStack_25f = 0;
          local_288.super_LineCol.col._0_4_ = 0x74613a3a;
          local_288.super_LineCol.col._4_4_ = 0x7428786f;
          local_288.name.str._0_1_ = 0x6f;
          local_288.name.str._1_1_ = 0x6b;
          local_288.name.str._2_2_ = 0x6e65;
          local_288.name.str._4_1_ = 0x2e;
          local_288.name.str._5_1_ = 0x76;
          local_288.name.str._6_1_ = 0x61;
          local_288.name.str._7_1_ = 0x6c;
          local_288.super_LineCol.offset._0_4_ = 0x63656863;
          local_288.super_LineCol.offset._4_4_ = 0x6166206b;
          local_288.super_LineCol.line._0_4_ = 0x64656c69;
          local_288.super_LineCol.line._4_4_ = 0x3463203a;
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          local_a8 = 0;
          uStack_a0 = 0x6953;
          local_98 = 0;
          pcStack_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x65;
          auVar6 = ZEXT1224(ZEXT412(0x6953) << 0x40);
          LVar7.name.str._0_4_ = 0x1fbf6a;
          LVar7.super_LineCol.offset = auVar6._0_8_;
          LVar7.super_LineCol.line = auVar6._8_8_;
          LVar7.super_LineCol.col = auVar6._16_8_;
          LVar7.name.str._4_4_ = 0;
          LVar7.name.len = 0x65;
          (*(this->m_callbacks).m_error)
                    ((char *)&local_288,0x2a,LVar7,(this->m_callbacks).m_user_data);
        }
        if (local_210.super_LineCol.offset == 0xffffffffffffffff) {
          local_288.super_LineCol.col._0_4_ = 0x2120736f;
          local_288.super_LineCol.col._4_4_ = 0x4f4e203d;
          local_288.name.str._0_1_ = 0x4e;
          local_288.name.str._1_1_ = 0x45;
          local_288.name.str._2_2_ = 0x29;
          local_288.super_LineCol.offset._0_4_ = 0x63656863;
          local_288.super_LineCol.offset._4_4_ = 0x6166206b;
          local_288.super_LineCol.line._0_4_ = 0x64656c69;
          local_288.super_LineCol.line._4_4_ = 0x7028203a;
          if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar4 = (code *)swi(3);
            sVar17 = (*pcVar4)();
            return sVar17;
          }
          local_d0 = 0;
          uStack_c8 = 0x6954;
          local_c0 = 0;
          pcStack_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b0 = 0x65;
          auVar6 = ZEXT1224(ZEXT412(0x6954) << 0x40);
          LVar8.name.str._0_4_ = 0x1fbf6a;
          LVar8.super_LineCol.offset = auVar6._0_8_;
          LVar8.super_LineCol.line = auVar6._8_8_;
          LVar8.super_LineCol.col = auVar6._16_8_;
          LVar8.name.str._4_4_ = 0;
          LVar8.name.len = 0x65;
          (*(this->m_callbacks).m_error)
                    ((char *)&local_288,0x1c,LVar8,(this->m_callbacks).m_user_data);
        }
        sVar17 = child(this,r->closest,local_210.super_LineCol.offset);
      }
      else {
        sVar17 = find_child(this,r->closest,&local_230.value);
      }
    }
    if (sVar17 != 0xffffffffffffffff) goto LAB_001cb32c;
    uVar1 = r->closest;
    if ((uVar1 == 0xffffffffffffffff) || (this->m_cap <= uVar1)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b86;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar1].m_type.type & MAP) == NOTYPE) {
      local_288.super_LineCol.col._0_4_ = 0x616d5f73;
      local_288.super_LineCol.col._4_4_ = 0x2d722870;
      local_288.name.str._0_1_ = 0x3e;
      local_288.name.str._1_1_ = 99;
      local_288.name.str._2_2_ = 0x6f6c;
      local_288.name.str._4_1_ = 0x73;
      local_288.name.str._5_1_ = 0x65;
      local_288.name.str._6_1_ = 0x73;
      local_288.super_LineCol.offset._0_4_ = 0x63656863;
      local_288.super_LineCol.offset._4_4_ = 0x6166206b;
      local_288.super_LineCol.line._0_4_ = 0x64656c69;
      local_288.super_LineCol.line._4_4_ = 0x6928203a;
      local_288.name.str._7_1_ = 0x74;
      local_288.name.len._0_1_ = 0x29;
      local_288.name.len._1_1_ = 0x29;
      local_288.name.len._2_1_ = 0;
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_f8 = 0;
      uStack_f0 = 0x695a;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(0x695a) << 0x40);
      LVar12.name.str._0_4_ = 0x1fbf6a;
      LVar12.super_LineCol.offset = auVar6._0_8_;
      LVar12.super_LineCol.line = auVar6._8_8_;
      LVar12.super_LineCol.col = auVar6._16_8_;
      LVar12.name.str._4_4_ = 0;
      LVar12.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_288,0x23,LVar12,(this->m_callbacks).m_user_data)
      ;
    }
    sVar20 = r->closest;
    if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b83;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar1 = this->m_buf[sVar20].m_last_child;
    if (sVar20 == 0xffffffffffffffff) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4cb1;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    if ((sVar20 == 0xffffffffffffffff) || (this->m_cap <= sVar20)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b86;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (((this->m_buf[sVar20].m_type.type & (STREAM|MAP)) == NOTYPE) &&
       (bVar16 = is_root(this,sVar20), !bVar16)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4cb2;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (uVar1 != 0xffffffffffffffff) {
      if (this->m_cap <= uVar1) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4b83;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (this->m_buf[uVar1].m_parent != sVar20) {
        if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar4 = (code *)swi(3);
          sVar17 = (*pcVar4)();
          return sVar17;
        }
        local_288.super_LineCol.offset._0_4_ = 0;
        local_288.super_LineCol.offset._4_4_ = 0;
        local_288.super_LineCol.line._0_4_ = 0x4cb3;
        local_288.super_LineCol.line._4_4_ = 0;
        local_288.super_LineCol.col._0_4_ = 0;
        local_288.super_LineCol.col._4_4_ = 0;
        local_288.name.str._0_1_ = 0x6a;
        local_288.name.str._1_1_ = 0xbf;
        local_288.name.str._2_2_ = 0x1f;
        local_288.name.str._4_1_ = 0;
        local_288.name.str._5_1_ = 0;
        local_288.name.str._6_1_ = 0;
        local_288.name.str._7_1_ = 0;
        local_288.name.len._0_1_ = 0x65;
        local_288.name.len._1_1_ = 0;
        local_288.name.len._2_1_ = 0;
        local_288.name.len._3_1_ = 0;
        local_288.name.len._4_2_ = 0;
        local_288.name.len._6_2_ = 0;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    sVar17 = _claim(this);
    _set_hierarchy(this,sVar17,sVar20,uVar1);
    if ((sVar17 == 0xffffffffffffffff) || (this->m_cap <= sVar17)) {
      if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar4 = (code *)swi(3);
        sVar17 = (*pcVar4)();
        return sVar17;
      }
      local_288.super_LineCol.offset._0_4_ = 0;
      local_288.super_LineCol.offset._4_4_ = 0;
      local_288.super_LineCol.line._0_4_ = 0x4b83;
      local_288.super_LineCol.line._4_4_ = 0;
      local_288.super_LineCol.col._0_4_ = 0;
      local_288.super_LineCol.col._4_4_ = 0;
      local_288.name.str._0_1_ = 0x6a;
      local_288.name.str._1_1_ = 0xbf;
      local_288.name.str._2_2_ = 0x1f;
      local_288.name.str._4_1_ = 0;
      local_288.name.str._5_1_ = 0;
      local_288.name.str._6_1_ = 0;
      local_288.name.str._7_1_ = 0;
      local_288.name.len._0_1_ = 0x65;
      local_288.name.len._1_1_ = 0;
      local_288.name.len._2_1_ = 0;
      local_288.name.len._3_1_ = 0;
      local_288.name.len._4_2_ = 0;
      local_288.name.len._6_2_ = 0;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pNVar18 = this->m_buf + sVar17;
    pcVar19 = &this->m_buf[sVar17].m_key.scalar;
    pcVar19->str = local_230.value.str;
    pcVar19->len = local_230.value.len;
    NVar22 = KEY;
  }
  (pNVar18->m_type).type = (pNVar18->m_type).type | NVar22;
LAB_001cb32c:
  if (sVar17 == 0xffffffffffffffff) {
    local_288.super_LineCol.col._0_4_ = 0x2065646f;
    local_288.super_LineCol.col._4_4_ = 0x4e203d21;
    local_288.name.str._0_1_ = 0x4f;
    local_288.name.str._1_1_ = 0x4e;
    local_288.name.str._2_2_ = 0x2945;
    local_288.name.str._4_1_ = 0;
    local_288.super_LineCol.offset._0_4_ = 0x63656863;
    local_288.super_LineCol.offset._4_4_ = 0x6166206b;
    local_288.super_LineCol.line._0_4_ = 0x64656c69;
    local_288.super_LineCol.line._4_4_ = 0x6e28203a;
    if (((s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar4 = (code *)swi(3);
      sVar17 = (*pcVar4)();
      return sVar17;
    }
    local_1e8 = 0;
    uStack_1e0 = 0x69a1;
    local_1d8 = 0;
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_1c8 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x69a1) << 0x40);
    LVar15.name.str._0_4_ = 0x1fbf6a;
    LVar15.super_LineCol.offset = auVar6._0_8_;
    LVar15.super_LineCol.line = auVar6._8_8_;
    LVar15.super_LineCol.col = auVar6._16_8_;
    LVar15.name.str._4_4_ = 0;
    LVar15.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_288,0x1d,LVar15,(this->m_callbacks).m_user_data);
  }
  ((NodeType *)&((lookup_result *)parent)->path_pos)->type = local_230.type.type;
  ((csubstr *)&((lookup_result *)parent)->target)->str = local_230.value.str;
  ((lookup_result *)parent)->closest = local_230.value.len;
  return sVar17;
}

Assistant:

size_t Tree::_next_node_modify(lookup_result * r, _lookup_path_token *parent)
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
                to_map(r->closest, key(r->closest));
            else
                to_map(r->closest);
        }
        else
        {
            if(is_map(r->closest))
                node = find_child(r->closest, token.value);
            else
            {
                size_t pos = NONE;
                _RYML_CB_CHECK(m_callbacks, c4::atox(token.value, &pos));
                _RYML_CB_ASSERT(m_callbacks, pos != NONE);
                node = child(r->closest, pos);
            }
        }
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
            node = append_child(r->closest);
            NodeData *n = _p(node);
            n->m_key.scalar = token.value;
            n->m_type.add(KEY);
        }
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
        {
            node = find_child(r->closest, token.value);
            if(node == NONE)
                node = append_child(r->closest);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, !is_seq(r->closest));
            _add_flags(r->closest, MAP);
            node = append_child(r->closest);
        }
        NodeData *n = _p(node);
        n->m_key.scalar = token.value;
        n->m_val.scalar = "";
        n->m_type.add(KEYVAL);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx;
        if( ! from_chars(token.value, &idx))
             return NONE;
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
            {
                csubstr k = key(r->closest);
                _clear_type(r->closest);
                to_seq(r->closest, k);
            }
            else
            {
                _clear_type(r->closest);
                to_seq(r->closest);
            }
        }
        _RYML_CB_ASSERT(m_callbacks, is_container(r->closest));
        node = child(r->closest, idx);
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, num_children(r->closest) <= idx);
            for(size_t i = num_children(r->closest); i <= idx; ++i)
            {
                node = append_child(r->closest);
                if(i < idx)
                {
                    if(is_map(r->closest))
                        to_keyval(node, /*"~"*/{}, /*"~"*/{});
                    else if(is_seq(r->closest))
                        to_val(node, /*"~"*/{});
                }
            }
        }
    }
    else
    {
        C4_NEVER_REACH();
    }

    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    *parent = token;
    return node;
}